

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ValidateMessage(Parser *this,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this_00;
  Parser *this_01;
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar2;
  bool bVar3;
  undefined1 *puVar4;
  int iVar5;
  int col;
  int line;
  int local_40;
  int local_3c;
  Parser *local_38;
  
  puVar4 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((MessageOptions *)puVar4 == (MessageOptions *)0x0) {
    puVar4 = _MessageOptions_default_instance_;
  }
  iVar5 = *(int *)((long)&((MessageOptions *)puVar4)->field_0 + 0x28);
  bVar3 = iVar5 < 1;
  if (0 < iVar5) {
    iVar5 = 0;
    local_38 = this;
    do {
      descriptor = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                             (&(((MessageOptions *)puVar4)->field_0)._impl_.uninterpreted_option_.
                               super_RepeatedPtrFieldBase,iVar5);
      if (0 < *(int *)((long)&descriptor->field_0 + 0x10)) {
        this_00 = &(descriptor->field_0)._impl_.name_;
        pVVar2 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                           (&this_00->super_RepeatedPtrFieldBase,0);
        if ((pVVar2->field_0)._impl_.is_extension_ == false) {
          pVVar2 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          iVar1 = std::__cxx11::string::compare
                            ((char *)((ulong)(pVVar2->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
          this_01 = local_38;
          if (iVar1 == 0) {
            local_3c = -1;
            local_40 = 0;
            if (local_38->source_location_table_ != (SourceLocationTable *)0x0) {
              SourceLocationTable::Find
                        (local_38->source_location_table_,&descriptor->super_Message,OPTION_NAME,
                         &local_3c,&local_40);
            }
            RecordError(this_01,local_3c,local_40,(ErrorMaker)ZEXT816(0x3e9bb1));
            return bVar3;
          }
        }
      }
      puVar4 = (undefined1 *)(proto->field_0)._impl_.options_;
      if ((MessageOptions *)puVar4 == (MessageOptions *)0x0) {
        puVar4 = _MessageOptions_default_instance_;
      }
      iVar5 = iVar5 + 1;
      iVar1 = *(int *)((long)&((MessageOptions *)puVar4)->field_0 + 0x28);
      bVar3 = iVar1 <= iVar5;
    } while (iVar5 < iVar1);
  }
  return bVar3;
}

Assistant:

bool Parser::ValidateMessage(const DescriptorProto* proto) {
  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption& option =
        proto->options().uninterpreted_option(i);
    if (option.name_size() > 0 && !option.name(0).is_extension() &&
        option.name(0).name_part() == "map_entry") {
      int line = -1, col = 0;  // indicates line and column not known
      if (source_location_table_ != nullptr) {
        source_location_table_->Find(
            &option, DescriptorPool::ErrorCollector::OPTION_NAME, &line, &col);
      }
      RecordError(line, col,
                  "map_entry should not be set explicitly. "
                  "Use map<KeyType, ValueType> instead.");
      return false;
    }
  }
  return true;
}